

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void removevars(FuncState *fs,int tolevel)

{
  Dyndata *pDVar1;
  byte bVar2;
  LocVar *pLVar3;
  LocVar *var;
  int tolevel_local;
  FuncState *fs_local;
  
  pDVar1 = fs->ls->dyd;
  (pDVar1->actvar).n = (pDVar1->actvar).n - ((uint)fs->nactvar - tolevel);
  while (tolevel < (int)(uint)fs->nactvar) {
    bVar2 = fs->nactvar - 1;
    fs->nactvar = bVar2;
    pLVar3 = localdebuginfo(fs,(uint)bVar2);
    if (pLVar3 != (LocVar *)0x0) {
      pLVar3->endpc = fs->pc;
    }
  }
  return;
}

Assistant:

static void removevars (FuncState *fs, int tolevel) {
  fs->ls->dyd->actvar.n -= (fs->nactvar - tolevel);
  while (fs->nactvar > tolevel) {
    LocVar *var = localdebuginfo(fs, --fs->nactvar);
    if (var)  /* does it have debug information? */
      var->endpc = fs->pc;
  }
}